

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O1

void __thiscall
boost::shared_ptr<boost::runtime::basic_param>::
shared_ptr<boost::runtime::parameter<std::__cxx11::string,(boost::runtime::args_amount)2,false>>
          (shared_ptr<boost::runtime::basic_param> *this,
          parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(boost::runtime::args_amount)2,_false>
          *p)

{
  sp_counted_base *psVar1;
  sp_counted_base *in_RAX;
  shared_count local_18;
  
  this->px = &p->super_basic_param;
  (this->pn).pi_ = (sp_counted_base *)0x0;
  local_18.pi_ = in_RAX;
  detail::shared_count::
  shared_count<boost::runtime::parameter<std::__cxx11::string,(boost::runtime::args_amount)2,false>>
            (&local_18,p);
  psVar1 = (this->pn).pi_;
  (this->pn).pi_ = local_18.pi_;
  local_18.pi_ = psVar1;
  detail::shared_count::~shared_count(&local_18);
  return;
}

Assistant:

explicit shared_ptr( Y * p ): px( p ), pn() // Y must be complete
    {
        boost::detail::sp_pointer_construct( this, p, pn );
    }